

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFilter.cpp
# Opt level: O2

void __thiscall KFilter::KFilter(KFilter *this,int state_dimension,int measurement_dimension)

{
  long cols;
  long size;
  IdentityReturnType local_60;
  MatrixXd *local_48;
  MatrixXd *local_40;
  VectorXd *local_38;
  
  local_40 = &this->P_;
  local_48 = &this->Q_;
  memset(this,0,0x88);
  this->measurement_dimension_ = measurement_dimension;
  this->state_dimension_ = state_dimension;
  size = (long)state_dimension;
  local_38 = &this->x_;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&local_60,size);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->x_,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_60);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,size,size);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->F_,&local_60);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,size,size);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (local_40,&local_60);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,size,size);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (local_48,&local_60);
  cols = (long)measurement_dimension;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,size,cols);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->H_,&local_60);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,cols,cols);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->R_,&local_60);
  return;
}

Assistant:

KFilter::KFilter(int state_dimension, int measurement_dimension) : 
    state_dimension_(state_dimension), 
    measurement_dimension_(measurement_dimension)
{
    // Initialize all matrices to correct size and default values
    // We'll directly set since we know these dimensions are valid
    x_ = VectorXd::Zero(state_dimension);
    F_ = MatrixXd::Identity(state_dimension, state_dimension);
    P_ = MatrixXd::Identity(state_dimension, state_dimension);
    Q_ = MatrixXd::Identity(state_dimension, state_dimension);
    H_ = MatrixXd::Identity(state_dimension, measurement_dimension);
    R_ = MatrixXd::Identity(measurement_dimension, measurement_dimension);
}